

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal-c.cpp
# Opt level: O3

bool duckdb::CastDecimalCInternal<duckdb_decimal>
               (duckdb_result *source,duckdb_decimal *result,idx_t col,idx_t row)

{
  byte bVar1;
  pointer pQVar2;
  reference this;
  void *source_address;
  duckdb_hugeint dVar3;
  
  pQVar2 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)source->internal_data);
  this = vector<duckdb::LogicalType,_true>::operator[](&(pQVar2->super_BaseQueryResult).types,col);
  LogicalType::GetDecimalProperties(this,&result->width,&result->scale);
  source_address = (void *)(row * 0x10 + (long)source->deprecated_columns[col].deprecated_data);
  bVar1 = result->width;
  if (bVar1 < 0x13) {
    if (bVar1 < 10) {
      if (bVar1 < 5) {
        dVar3 = FetchInternals<short>(source_address);
      }
      else {
        dVar3 = FetchInternals<int>(source_address);
      }
    }
    else {
      dVar3 = FetchInternals<long>(source_address);
    }
  }
  else {
    dVar3 = FetchInternals<duckdb::hugeint_t>(source_address);
  }
  result->value = dVar3;
  return true;
}

Assistant:

bool CastDecimalCInternal(duckdb_result *source, duckdb_decimal &result, idx_t col, idx_t row) {
	auto result_data = (duckdb::DuckDBResultData *)source->internal_data;
	result_data->result->types[col].GetDecimalProperties(result.width, result.scale);
	auto source_address = UnsafeFetchPtr<hugeint_t>(source, col, row);

	if (result.width > duckdb::Decimal::MAX_WIDTH_INT64) {
		result.value = FetchInternals<hugeint_t>(source_address);
	} else if (result.width > duckdb::Decimal::MAX_WIDTH_INT32) {
		result.value = FetchInternals<int64_t>(source_address);
	} else if (result.width > duckdb::Decimal::MAX_WIDTH_INT16) {
		result.value = FetchInternals<int32_t>(source_address);
	} else {
		result.value = FetchInternals<int16_t>(source_address);
	}
	return true;
}